

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genrand.c
# Opt level: O1

void init_genrand(unsigned_long s)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = s & 0xffffffff;
  lVar2 = 1;
  mt[0] = uVar1;
  do {
    uVar1 = (ulong)(((uint)(uVar1 >> 0x1e) ^ (uint)uVar1) * 0x6c078965 + (int)lVar2);
    mt[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  mti = 0x270;
  return;
}

Assistant:

void
init_genrand(unsigned long s)
{
    mt[0] = s & 0xffffffffUL;
    for (mti = 1; mti < N; mti++) {
        mt[mti] =
            (1812433253UL * (mt[mti - 1] ^ (mt[mti - 1] >> 30)) + mti);
        /* See Knuth TAOCP Vol2. 3rd Ed. P.106 for multiplier. */
        /* In the previous versions, MSBs of the seed affect   */
        /* only MSBs of the array mt[].                        */
        /* 2002/01/09 modified by Makoto Matsumoto             */
        mt[mti] &= 0xffffffffUL;
        /* for >32 bit machines */
    }
}